

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

optional<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult> * __thiscall
wasm::WATParser::anon_unknown_0::LexAnnotationCtx::lexed
          (optional<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>
           *__return_storage_ptr__,LexAnnotationCtx *this)

{
  bool bVar1;
  LexResult *pLVar2;
  basic_string_view<char,_std::char_traits<char>_> str;
  LexAnnotationResult local_58;
  undefined1 local_28 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexResult> basic;
  LexAnnotationCtx *this_local;
  
  basic.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
  _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>._16_8_
       = this;
  LexCtx::lexed((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)local_28,
                &this->super_LexCtx);
  bVar1 = std::optional::operator_cast_to_bool((optional *)local_28);
  if (bVar1) {
    pLVar2 = std::optional<wasm::WATParser::(anonymous_namespace)::LexResult>::operator*
                       ((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)local_28);
    local_58.super_LexResult.span._M_len = (pLVar2->span)._M_len;
    local_58.super_LexResult.span._M_str = (pLVar2->span)._M_str;
    str = std::basic_string_view<char,_std::char_traits<char>_>::substr
                    (&this->kind,0,this->kindSize);
    wasm::Name::Name(&local_58.annotation.kind,str);
    local_58.annotation.contents =
         std::basic_string_view<char,_std::char_traits<char>_>::substr
                   (&this->contents,0,this->contentsSize);
    std::optional<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>::
    optional<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true>
              (__return_storage_ptr__,&local_58);
  }
  else {
    std::optional<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>::optional
              (__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<LexAnnotationResult> lexed() {
    if (auto basic = LexCtx::lexed()) {
      return LexAnnotationResult{
        *basic,
        {Name(kind.substr(0, kindSize)), contents.substr(0, contentsSize)}};
    }
    return std::nullopt;
  }